

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  uint *puVar1;
  TRef *pTVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  TRef TVar6;
  TRef TVar7;
  TValue *pTVar8;
  GCobj *o;
  IRRef1 IVar9;
  long lVar10;
  ulong uVar11;
  void *ptr;
  RecordIndex ix;
  
  pTVar2 = J->base;
  pTVar8 = J->L->base;
  uVar3 = (ulong)func;
  uVar11 = uVar3;
  for (lVar10 = 0; lVar10 <= nargs; lVar10 = lVar10 + 1) {
    if (J->base[uVar11] == 0) {
      sload(J,(int32_t)uVar11);
    }
    uVar11 = uVar11 + 1;
  }
  pTVar8 = pTVar8 + uVar3;
  puVar1 = pTVar2 + uVar3;
  uVar5 = *puVar1;
  if ((uVar5 & 0x1f000000) != 0x8000000) {
    ix.tabv.u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar8;
    ix.tab = uVar5;
    iVar4 = lj_record_mm_lookup(J,&ix,MM_call);
    if ((iVar4 == 0) || ((ix.mobj & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J,LJ_TRERR_NOMM);
    }
    nargs = nargs + 1;
    for (lVar10 = nargs; 0 < lVar10; lVar10 = lVar10 + -1) {
      puVar1[lVar10] = puVar1[lVar10 + -1];
    }
    *puVar1 = ix.mobj;
    pTVar8 = &ix.mobjv;
    uVar5 = ix.mobj;
  }
  o = (GCobj *)(ulong)(pTVar8->u32).lo;
  IVar9 = (IRRef1)uVar5;
  if (((o->gch).unused1 == '\0') &&
     (ptr = (void *)(ulong)(o->gch).metatable.gcptr32, 0x5f < *(byte *)((long)ptr + -0x1b))) {
    (J->fold).ins.field_0.op1 = IVar9;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050002;
    TVar6 = lj_opt_fold(J);
    TVar7 = lj_ir_kptr_(J,IR_KPTR,ptr);
    (J->fold).ins.field_0.ot = 0x885;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
    lj_ir_kgc(J,(GCobj *)((long)ptr + -0x40),IRT_PROTO);
  }
  else {
    uVar5 = lj_ir_kgc(J,o,IRT_FUNC);
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = IVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar5;
    lj_opt_fold(J);
  }
  *puVar1 = uVar5 | 0x10000;
  J->maxslot = (BCReg)nargs;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef *fbase = &J->base[func];
  ptrdiff_t i;
  for (i = 0; i <= nargs; i++)
    (void)getslot(J, func+i);  /* Ensure func and all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > 0; i--)  /* Shift arguments up. */
      fbase[i] = fbase[i-1];
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  fbase[0] = TREF_FRAME | rec_call_specialize(J, funcV(functv), fbase[0]);
  J->maxslot = (BCReg)nargs;
}